

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O3

pair<HighsSplitDeque::Status,_HighsTask_*> __thiscall HighsSplitDeque::pop(HighsSplitDeque *this)

{
  element_type *peVar1;
  bool bVar2;
  undefined8 uVar3;
  uint uVar4;
  uint32_t uVar5;
  HighsTask *pHVar6;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar7;
  
  uVar4 = (this->ownerData).head;
  if (uVar4 == 0) {
    return (pair<HighsSplitDeque::Status,_HighsTask_*>)ZEXT816(0);
  }
  if (0x2000 < uVar4) {
    (this->ownerData).head = uVar4 - 1;
    uVar3 = 3;
    pHVar6 = (HighsTask *)0x0;
    goto LAB_002236a6;
  }
  if ((this->ownerData).allStolenCopy == true) {
LAB_00223636:
    pHVar6 = (this->taskArray)._M_elems + (uVar4 - 1);
    uVar3 = 1;
  }
  else {
    if ((this->ownerData).splitCopy == uVar4) {
      bVar2 = shrinkShared(this);
      uVar4 = (this->ownerData).head;
      if (bVar2) goto LAB_00223636;
    }
    uVar5 = uVar4 - 1;
    (this->ownerData).head = uVar5;
    if (uVar5 == 0) {
      if ((this->ownerData).allStolenCopy == false) {
        (this->ownerData).allStolenCopy = true;
        (this->stealerData).allStolen._M_base._M_i = true;
        peVar1 = (this->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        (peVar1->haveJobs).super___atomic_base<int>._M_i =
             (peVar1->haveJobs).super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
    }
    else if (uVar5 != (this->ownerData).splitCopy) {
      growShared(this);
    }
    pHVar6 = (this->taskArray)._M_elems + (this->ownerData).head;
    uVar3 = 2;
  }
LAB_002236a6:
  pVar7.second = pHVar6;
  pVar7._0_8_ = uVar3;
  return pVar7;
}

Assistant:

std::pair<Status, HighsTask*> pop() {
    if (ownerData.head == 0) return std::make_pair(Status::kEmpty, nullptr);

    if (ownerData.head > kTaskArraySize) {
      // task queue was full and the overflown tasks have
      // been directly executed
      ownerData.head -= 1;
      return std::make_pair(Status::kOverflown, nullptr);
    }

    if (ownerData.allStolenCopy)
      return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);

    if (ownerData.splitCopy == ownerData.head) {
      if (shrinkShared())
        return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);
    }

    ownerData.head -= 1;

    if (ownerData.head == 0) {
      if (!ownerData.allStolenCopy) {
        ownerData.allStolenCopy = true;
        stealerData.allStolen.store(true, std::memory_order_relaxed);
        ownerData.workerBunk->haveJobs.fetch_add(-1, std::memory_order_release);
      }
    } else if (ownerData.head != ownerData.splitCopy)
      growShared();

    return std::make_pair(Status::kWork, &taskArray[ownerData.head]);
  }